

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O3

void __thiscall
duckdb::GetTreeWidthHeight<duckdb::LogicalOperator>
          (duckdb *this,LogicalOperator *op,idx_t *width,idx_t *height)

{
  idx_t iVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((LogicalOperator *)this == op) {
    *width = 1;
    iVar1 = 1;
  }
  else {
    *width = 0;
    *height = 0;
    local_10 = std::
               _Function_handler<void_(const_duckdb::LogicalOperator_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:81:39)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_duckdb::LogicalOperator_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:81:39)>
               ::_M_manager;
    local_28._M_unused._M_object = width;
    local_28._8_8_ = height;
    anon_unknown.dwarf_9894fa::TreeChildrenIterator::Iterate<duckdb::LogicalOperator>
              ((TreeChildrenIterator *)this,op,
               (function<void_(const_duckdb::LogicalOperator_&)> *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
    }
    iVar1 = *height + 1;
  }
  *height = iVar1;
  return;
}

Assistant:

static void GetTreeWidthHeight(const T &op, idx_t &width, idx_t &height) {
	if (!TreeChildrenIterator::HasChildren(op)) {
		width = 1;
		height = 1;
		return;
	}
	width = 0;
	height = 0;

	TreeChildrenIterator::Iterate<T>(op, [&](const T &child) {
		idx_t child_width, child_height;
		GetTreeWidthHeight<T>(child, child_width, child_height);
		width += child_width;
		height = MaxValue<idx_t>(height, child_height);
	});
	height++;
}